

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

void enet_peer_reset(ENetPeer *peer)

{
  ENetPeer *in_RDI;
  
  enet_peer_on_disconnect(in_RDI);
  in_RDI->outgoingPeerID = 0xffffff;
  in_RDI->connectID = 0;
  in_RDI->state = ENET_PEER_STATE_DISCONNECTED;
  in_RDI->incomingBandwidth = 0;
  in_RDI->outgoingBandwidth = 0;
  in_RDI->incomingBandwidthThrottleEpoch = 0;
  in_RDI->outgoingBandwidthThrottleEpoch = 0;
  in_RDI->incomingDataTotal = 0;
  in_RDI->outgoingDataTotal = 0;
  in_RDI->lastSendTime = 0;
  in_RDI->lastReceiveTime = 0;
  in_RDI->nextTimeout = 0;
  in_RDI->earliestTimeout = 0;
  in_RDI->packetLossEpoch = 0;
  in_RDI->packetsSent = 0;
  in_RDI->packetsLost = 0;
  in_RDI->packetLoss = 0;
  in_RDI->packetLossVariance = 0;
  in_RDI->packetThrottle = 0x20;
  in_RDI->packetThrottleLimit = 0x20;
  in_RDI->packetThrottleCounter = 0;
  in_RDI->packetThrottleEpoch = 0;
  in_RDI->packetThrottleAcceleration = 2;
  in_RDI->packetThrottleDeceleration = 2;
  in_RDI->packetThrottleInterval = 5000;
  in_RDI->pingInterval = 500;
  in_RDI->timeoutLimit = 0x20;
  in_RDI->timeoutMinimum = 5000;
  in_RDI->timeoutMaximum = 30000;
  in_RDI->lastRoundTripTime = 500;
  in_RDI->lowestRoundTripTime = 500;
  in_RDI->lastRoundTripTimeVariance = 0;
  in_RDI->highestRoundTripTimeVariance = 0;
  in_RDI->roundTripTime = 500;
  in_RDI->roundTripTimeVariance = 0;
  in_RDI->mtu = in_RDI->host->mtu;
  in_RDI->reliableDataInTransit = 0;
  in_RDI->outgoingReliableSequenceNumber = 0;
  in_RDI->windowSize = 0x10000;
  in_RDI->incomingUnsequencedGroup = 0;
  in_RDI->outgoingUnsequencedGroup = 0;
  in_RDI->eventData = 0;
  in_RDI->totalWaitingData = 0;
  memset(in_RDI->unsequencedWindow,0,0x80);
  enet_peer_reset_queues(peer);
  return;
}

Assistant:

void
enet_peer_reset (ENetPeer * peer)
{
    enet_peer_on_disconnect (peer);
        
    peer -> outgoingPeerID = ENET_PROTOCOL_MAXIMUM_PEER_ID;
    peer -> connectID = 0;

    peer -> state = ENET_PEER_STATE_DISCONNECTED;

    peer -> incomingBandwidth = 0;
    peer -> outgoingBandwidth = 0;
    peer -> incomingBandwidthThrottleEpoch = 0;
    peer -> outgoingBandwidthThrottleEpoch = 0;
    peer -> incomingDataTotal = 0;
    peer -> outgoingDataTotal = 0;
    peer -> lastSendTime = 0;
    peer -> lastReceiveTime = 0;
    peer -> nextTimeout = 0;
    peer -> earliestTimeout = 0;
    peer -> packetLossEpoch = 0;
    peer -> packetsSent = 0;
    peer -> packetsLost = 0;
    peer -> packetLoss = 0;
    peer -> packetLossVariance = 0;
    peer -> packetThrottle = ENET_PEER_DEFAULT_PACKET_THROTTLE;
    peer -> packetThrottleLimit = ENET_PEER_PACKET_THROTTLE_SCALE;
    peer -> packetThrottleCounter = 0;
    peer -> packetThrottleEpoch = 0;
    peer -> packetThrottleAcceleration = ENET_PEER_PACKET_THROTTLE_ACCELERATION;
    peer -> packetThrottleDeceleration = ENET_PEER_PACKET_THROTTLE_DECELERATION;
    peer -> packetThrottleInterval = ENET_PEER_PACKET_THROTTLE_INTERVAL;
    peer -> pingInterval = ENET_PEER_PING_INTERVAL;
    peer -> timeoutLimit = ENET_PEER_TIMEOUT_LIMIT;
    peer -> timeoutMinimum = ENET_PEER_TIMEOUT_MINIMUM;
    peer -> timeoutMaximum = ENET_PEER_TIMEOUT_MAXIMUM;
    peer -> lastRoundTripTime = ENET_PEER_DEFAULT_ROUND_TRIP_TIME;
    peer -> lowestRoundTripTime = ENET_PEER_DEFAULT_ROUND_TRIP_TIME;
    peer -> lastRoundTripTimeVariance = 0;
    peer -> highestRoundTripTimeVariance = 0;
    peer -> roundTripTime = ENET_PEER_DEFAULT_ROUND_TRIP_TIME;
    peer -> roundTripTimeVariance = 0;
    peer -> mtu = peer -> host -> mtu;
    peer -> reliableDataInTransit = 0;
    peer -> outgoingReliableSequenceNumber = 0;
    peer -> windowSize = ENET_PROTOCOL_MAXIMUM_WINDOW_SIZE;
    peer -> incomingUnsequencedGroup = 0;
    peer -> outgoingUnsequencedGroup = 0;
    peer -> eventData = 0;
    peer -> totalWaitingData = 0;

    memset (peer -> unsequencedWindow, 0, sizeof (peer -> unsequencedWindow));
    
    enet_peer_reset_queues (peer);
}